

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

int __thiscall HydEngine::timeToCloseTank(HydEngine *this,int tstep)

{
  pointer ppNVar1;
  Tank *this_00;
  int iVar2;
  int iVar3;
  Tank *tank;
  pointer ppNVar4;
  Tank *pTVar5;
  Tank *pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  HydEngine *local_38;
  
  ppNVar1 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pTVar5 = (Tank *)0x0;
  local_38 = this;
  for (ppNVar4 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    this_00 = (Tank *)*ppNVar4;
    iVar2 = (*(this_00->super_Node).super_Element._vptr_Element[2])(this_00);
    pTVar6 = pTVar5;
    iVar3 = tstep;
    if (iVar2 == 1) {
      iVar3 = Tank::timeToVolume(this_00,this_00->minVolume);
      if (iVar3 < 1) {
        iVar3 = Tank::timeToVolume(this_00,this_00->maxVolume);
      }
      pTVar6 = this_00;
      if (iVar3 < 1 || tstep <= iVar3) {
        pTVar6 = pTVar5;
        iVar3 = tstep;
      }
    }
    tstep = iVar3;
    pTVar5 = pTVar6;
  }
  if (pTVar5 != (Tank *)0x0) {
    std::operator+(&local_58,"  (Tank ",&(pTVar5->super_Node).super_Element.name);
    std::operator+(&local_78,&local_58," closed)");
    std::__cxx11::string::operator=((string *)&local_38->timeStepReason,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return tstep;
}

Assistant:

int HydEngine::timeToCloseTank(int tstep)
{
    Tank* closedTank = nullptr;
    for (Node* node : network->nodes)
    {
        // ... check if node is a tank

        if ( node->type() == Node::TANK )
        {
            // ... find the time to fill (or empty) the tank

            Tank* tank = static_cast<Tank*>(node);
            int t = tank->timeToVolume(tank->minVolume);
            if ( t <= 0 ) t = tank->timeToVolume(tank->maxVolume);

            // ... compare this time with current time step

            if ( t > 0 && t < tstep )
            {
                tstep = t;
                closedTank = tank;
            }
        }
    }
    if ( closedTank )
    {
        timeStepReason = "  (Tank " + closedTank->name + " closed)";
    }
    return tstep;
}